

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt tt_cmap14_char_map_def_binary(FT_Byte *base,FT_UInt32 char_code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = *(uint *)base;
  uVar3 = 0;
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  do {
    uVar1 = uVar2;
    if (uVar1 <= uVar3) {
      return 0;
    }
    uVar2 = uVar1 + uVar3 >> 1;
    uVar4 = (ulong)(uVar2 * 4);
    uVar5 = (uint)base[uVar4 + 6] | (uint)base[uVar4 + 5] << 8 | (uint)base[uVar4 + 4] << 0x10;
  } while ((char_code < uVar5) ||
          (uVar3 = uVar2 + 1, uVar2 = uVar1, uVar5 + base[uVar4 + 7] < char_code));
  return 1;
}

Assistant:

static FT_UInt
  tt_cmap14_char_map_def_binary( FT_Byte    *base,
                                 FT_UInt32   char_code )
  {
    FT_UInt32  numRanges = TT_PEEK_ULONG( base );
    FT_UInt32  max, min;


    min = 0;
    max = numRanges;

    base += 4;

    /* binary search */
    while ( min < max )
    {
      FT_UInt32  mid   = ( min + max ) >> 1;
      FT_Byte*   p     = base + 4 * mid;
      FT_ULong   start = TT_NEXT_UINT24( p );
      FT_UInt    cnt   = FT_NEXT_BYTE( p );


      if ( char_code < start )
        max = mid;
      else if ( char_code > start + cnt )
        min = mid + 1;
      else
        return TRUE;
    }

    return FALSE;
  }